

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O0

Diagnostic * __thiscall
slang::ast::EvalContext::addDiag(EvalContext *this,DiagCode code,SourceRange range)

{
  SourceRange range_00;
  SourceRange range_01;
  DiagnosticSeverity DVar1;
  Diagnostics *in_RCX;
  SourceLocation in_RDX;
  undefined4 in_ESI;
  Diagnostic *diag;
  bool isError;
  Diagnostic *in_stack_000002a8;
  EvalContext *in_stack_000002b0;
  undefined8 local_70;
  Diagnostics *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  SourceLocation in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  DiagCode code_00;
  DiagCode in_stack_ffffffffffffffd0;
  
  code_00 = SUB84((ulong)in_stack_ffffffffffffffc0 >> 0x20,0);
  DVar1 = getDefaultSeverity(in_stack_ffffffffffffffd0);
  if ((int)DVar1 < 3) {
    range_01.startLoc._4_4_ = in_ESI;
    range_01.startLoc._0_4_ = in_stack_ffffffffffffffb0;
    range_01.endLoc = in_stack_ffffffffffffffb8;
    local_70 = Diagnostics::add(in_RCX,code_00,range_01);
  }
  else {
    range_00.startLoc._4_4_ = in_stack_ffffffffffffffb4;
    range_00.startLoc._0_4_ = in_stack_ffffffffffffffb0;
    range_00.endLoc = in_RDX;
    local_70 = Diagnostics::add(in_stack_ffffffffffffffa8,SUB84((ulong)in_RCX >> 0x20,0),range_00);
  }
  reportStack(in_stack_000002b0,in_stack_000002a8);
  return local_70;
}

Assistant:

Diagnostic& EvalContext::addDiag(DiagCode code, SourceRange range) {
    const bool isError = getDefaultSeverity(code) >= DiagnosticSeverity::Error;
    auto& diag = isError ? diags.add(code, range) : warnings.add(code, range);
    reportStack(diag);
    return diag;
}